

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

void __thiscall
wasm::WATParser::ParseTypeDefsCtx::ParseTypeDefsCtx
          (ParseTypeDefsCtx *this,Lexer *in,TypeBuilder *builder,IndexMap *typeIndices)

{
  size_t __n;
  allocator_type local_21;
  
  (this->super_TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>).typeIndices = typeIndices;
  Lexer::Lexer(&this->in,in);
  this->builder = builder;
  __n = TypeBuilder::size(builder);
  std::vector<wasm::TypeNames,_std::allocator<wasm::TypeNames>_>::vector(&this->names,__n,&local_21)
  ;
  this->index = 0;
  return;
}

Assistant:

ParseTypeDefsCtx(Lexer& in, TypeBuilder& builder, const IndexMap& typeIndices)
    : TypeParserCtx<ParseTypeDefsCtx>(typeIndices), in(in), builder(builder),
      names(builder.size()) {}